

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenerators::SetupAutoGenerateTarget(cmQtAutoGenerators *this,cmTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  _Alloc_hider infile;
  _Alloc_hider outfile;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char *value;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configIncludes;
  mode_t perm;
  string inputFile;
  string error;
  string outputFile;
  string targetDir;
  string autogenTargetName;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configDefines;
  ofstream infoFile;
  undefined1 local_3b0 [32];
  _Rb_tree_node_base *local_390;
  size_t local_388;
  mode_t mStack_37c;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_290;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_260;
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte local_210 [216];
  ios_base local_138 [264];
  
  this_00 = target->Makefile;
  cmMakefile::PushScope(this_00);
  getAutogenTargetName_abi_cxx11_(&local_2b0,target);
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"_moc_target_name","");
  cmOutputConverter::EscapeForCMake((string *)local_3b0,&local_2b0);
  cmMakefile::AddDefinition(this_00,(string *)local_230,(char *)local_3b0._0_8_);
  pcVar6 = local_3b0 + 0x10;
  if ((char *)local_3b0._0_8_ != pcVar6) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"_origin_target_name","");
  local_318 = &target->Name;
  cmOutputConverter::EscapeForCMake((string *)local_3b0,local_318);
  cmMakefile::AddDefinition(this_00,(string *)local_230,(char *)local_3b0._0_8_);
  if ((char *)local_3b0._0_8_ != pcVar6) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  getAutogenTargetDir_abi_cxx11_(&local_2d0,target);
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Qt5Core_VERSION_MAJOR","");
  value = cmMakefile::GetDefinition(this_00,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (value == (char *)0x0) {
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"QT_VERSION_MAJOR","");
    value = cmMakefile::GetDefinition(this_00,(string *)local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"QT_MAJOR_VERSION","");
  local_3b0._0_8_ = pcVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"");
  pcVar5 = cmTarget::GetLinkInterfaceDependentStringProperty
                     (target,(string *)local_230,(string *)local_3b0);
  if ((char *)local_3b0._0_8_ != pcVar6) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (pcVar5 != (char *)0x0) {
    value = pcVar5;
  }
  if (value != (char *)0x0) {
    local_230._0_8_ = &local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"_target_qt_version","");
    cmMakefile::AddDefinition(this_00,(string *)local_230,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != &local_220) {
      operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
    }
  }
  local_3b0._24_8_ = local_3b0 + 8;
  local_3b0._8_4_ = _S_red;
  local_3b0._16_8_ = 0;
  local_388 = 0;
  local_260._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_260._M_impl.super__Rb_tree_header._M_header;
  local_260._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_260._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_260._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_290._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_290._M_impl.super__Rb_tree_header._M_header;
  local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_390 = (_Rb_tree_node_base *)local_3b0._24_8_;
  local_290._M_impl.super__Rb_tree_header._M_header._M_right =
       local_290._M_impl.super__Rb_tree_header._M_header._M_left;
  local_260._M_impl.super__Rb_tree_header._M_header._M_right =
       local_260._M_impl.super__Rb_tree_header._M_header._M_left;
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"AUTOMOC","");
  bVar2 = cmTarget::GetPropertyAsBool(target,(string *)local_230);
  bVar4 = true;
  if (!bVar2) {
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"AUTOUIC","");
    bVar3 = cmTarget::GetPropertyAsBool(target,&local_310);
    if (!bVar3) {
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"AUTORCC","");
      bVar4 = cmTarget::GetPropertyAsBool(target,&local_2f0);
      bVar3 = true;
      goto LAB_0033eff1;
    }
  }
  bVar3 = false;
LAB_0033eff1:
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2)) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2)) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (bVar4 != false) {
    SetupSourceFiles(this,target);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"_cpp_files","");
  cmOutputConverter::EscapeForCMake(&local_378,&this->Sources);
  cmMakefile::AddDefinition(this_00,(string *)local_230,local_378._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"AUTOMOC","");
  bVar2 = cmTarget::GetPropertyAsBool(target,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (bVar2) {
    SetupAutoMocTarget(this,target,&local_2b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_3b0,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_260);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"AUTOUIC","");
  bVar2 = cmTarget::GetPropertyAsBool(target,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (bVar2) {
    SetupAutoUicTarget(this,target,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_290);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"AUTORCC","");
  bVar2 = cmTarget::GetPropertyAsBool(target,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  if (bVar2) {
    SetupAutoRccTarget(this,target);
  }
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"CMAKE_ROOT","");
  pcVar6 = cmMakefile::GetSafeDefinition(this_00,(string *)local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string((string *)&local_378,pcVar6,(allocator *)local_230);
  std::__cxx11::string::append((char *)&local_378);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_2d0._M_dataplus._M_p,
             local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
  std::__cxx11::string::append((char *)&local_338);
  local_230._0_8_ = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"_qt_rcc_inputs","");
  std::operator+(&local_358,"_qt_rcc_inputs_",local_318);
  pcVar6 = cmMakefile::GetDefinition(this_00,&local_358);
  cmMakefile::AddDefinition(this_00,(string *)local_230,pcVar6);
  paVar1 = &local_358.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != paVar1) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._0_8_ != &local_220) {
    operator_delete((void *)local_230._0_8_,local_220._M_allocated_capacity + 1);
  }
  outfile._M_p = local_338._M_dataplus._M_p;
  infile._M_p = local_378._M_dataplus._M_p;
  cmNewLineStyle::cmNewLineStyle((cmNewLineStyle *)local_230);
  cmMakefile::ConfigureFile
            (this_00,infile._M_p,outfile._M_p,false,true,false,(cmNewLineStyle *)local_230);
  mStack_37c = 0;
  cmsys::SystemTools::GetPermissions(&local_338,&mStack_37c);
  if (-1 < (char)mStack_37c) {
    cmsys::SystemTools::SetPermissions(&local_338,mStack_37c | 0x80);
  }
  if (((local_260._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_388 != 0)) ||
     (local_290._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    std::ofstream::ofstream(local_230,local_338._M_dataplus._M_p,_S_app);
    if ((local_210[*(long *)(local_230._0_8_ + -0x18)] & 5) == 0) {
      if ((_Rb_tree_header *)local_260._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_260._M_impl.super__Rb_tree_header &&
          local_260._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var8 = local_260._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"set(AM_MOC_COMPILE_DEFINITIONS_",0x1f);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_230,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_260._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_node_base *)local_3b0._24_8_ != (_Rb_tree_node_base *)(local_3b0 + 8) &&
          local_388 != 0) {
        p_Var9 = (_Rb_tree_node_base *)local_3b0._24_8_;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"set(AM_MOC_INCLUDES_",0x14);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_230,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
        } while (p_Var9 != (_Rb_tree_node_base *)(local_3b0 + 8));
      }
      if ((_Rb_tree_header *)local_290._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_290._M_impl.super__Rb_tree_header &&
          local_290._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var8 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_230,"set(AM_UIC_TARGET_OPTIONS_",0x1a);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_230,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")\n",2);
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_290._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_358._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_358,"Internal CMake error when trying to open file: ","");
      std::__cxx11::string::append((char *)&local_358);
      std::__cxx11::string::append((char *)&local_358);
      cmSystemTools::Error(local_358._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != paVar1) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
    }
    local_230._0_8_ = _VTT;
    *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = __M_insert<void_const*>;
    std::filebuf::~filebuf((filebuf *)(local_230 + 8));
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_260);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_3b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  cmMakefile::PopScope(this_00);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoGenerateTarget(cmTarget const* target)
{
  cmMakefile* makefile = target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = getAutogenTargetName(target);

  makefile->AddDefinition("_moc_target_name",
          cmOutputConverter::EscapeForCMake(autogenTargetName).c_str());
  makefile->AddDefinition("_origin_target_name",
          cmOutputConverter::EscapeForCMake(target->GetName()).c_str());

  std::string targetDir = getAutogenTargetDir(target);

  const char *qtVersion = makefile->GetDefinition("Qt5Core_VERSION_MAJOR");
  if (!qtVersion)
    {
    qtVersion = makefile->GetDefinition("QT_VERSION_MAJOR");
    }
  if (const char *targetQtVersion =
      target->GetLinkInterfaceDependentStringProperty("QT_MAJOR_VERSION", ""))
    {
    qtVersion = targetQtVersion;
    }
  if (qtVersion)
    {
    makefile->AddDefinition("_target_qt_version", qtVersion);
    }

  std::map<std::string, std::string> configIncludes;
  std::map<std::string, std::string> configDefines;
  std::map<std::string, std::string> configUicOptions;

  if (target->GetPropertyAsBool("AUTOMOC")
      || target->GetPropertyAsBool("AUTOUIC")
      || target->GetPropertyAsBool("AUTORCC"))
    {
    this->SetupSourceFiles(target);
    }
  makefile->AddDefinition("_cpp_files",
          cmOutputConverter::EscapeForCMake(this->Sources).c_str());
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    this->SetupAutoMocTarget(target, autogenTargetName,
                             configIncludes, configDefines);
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    this->SetupAutoUicTarget(target, configUicOptions);
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    this->SetupAutoRccTarget(target);
    }

  const char* cmakeRoot = makefile->GetSafeDefinition("CMAKE_ROOT");
  std::string inputFile = cmakeRoot;
  inputFile += "/Modules/AutogenInfo.cmake.in";
  std::string outputFile = targetDir;
  outputFile += "/AutogenInfo.cmake";
  makefile->AddDefinition("_qt_rcc_inputs",
              makefile->GetDefinition("_qt_rcc_inputs_" + target->GetName()));
  makefile->ConfigureFile(inputFile.c_str(), outputFile.c_str(),
                          false, true, false);

  // Ensure we have write permission in case .in was read-only.
  mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
  mode_t mode_write = S_IWRITE;
#else
  mode_t mode_write = S_IWUSR;
#endif
  cmSystemTools::GetPermissions(outputFile, perm);
  if (!(perm & mode_write))
    {
    cmSystemTools::SetPermissions(outputFile, perm | mode_write);
    }
  if (!configDefines.empty()
      || !configIncludes.empty()
      || !configUicOptions.empty())
    {
    cmsys::ofstream infoFile(outputFile.c_str(), std::ios::app);
    if ( !infoFile )
      {
      std::string error = "Internal CMake error when trying to open file: ";
      error += outputFile.c_str();
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
      return;
      }
    if (!configDefines.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configDefines.begin(), end = configDefines.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_COMPILE_DEFINITIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configIncludes.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configIncludes.begin(), end = configIncludes.end();
            it != end; ++it)
        {
        infoFile << "set(AM_MOC_INCLUDES_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    if (!configUicOptions.empty())
      {
      for (std::map<std::string, std::string>::iterator
            it = configUicOptions.begin(), end = configUicOptions.end();
            it != end; ++it)
        {
        infoFile << "set(AM_UIC_TARGET_OPTIONS_" << it->first <<
          " " << it->second << ")\n";
        }
      }
    }
}